

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O0

void cf_curve25519_mul(uint8_t *q,uint8_t *n,uint8_t *p)

{
  long b_00;
  int64_t r;
  ulong uStack_3d0;
  int i_1;
  size_t i;
  gf f;
  gf e;
  gf d;
  gf c;
  gf b;
  gf a;
  gf x;
  uint8_t z [32];
  uint8_t *p_local;
  uint8_t *n_local;
  uint8_t *q_local;
  
  for (uStack_3d0 = 0; uStack_3d0 < 0x1f; uStack_3d0 = uStack_3d0 + 1) {
    *(uint8_t *)((long)x + uStack_3d0 + 0x78) = n[uStack_3d0];
  }
  x[0xf]._0_1_ = (byte)x[0xf] & 0xf8;
  unpack25519(a + 0xf,p);
  for (uStack_3d0 = 0; uStack_3d0 < 0x10; uStack_3d0 = uStack_3d0 + 1) {
    c[uStack_3d0 + 0xf] = a[uStack_3d0 + 0xf];
    d[uStack_3d0 + 0xf] = 0;
    b[uStack_3d0 + 0xf] = 0;
    e[uStack_3d0 + 0xf] = 0;
  }
  e[0xf] = 1;
  b[0xf] = 1;
  for (r._4_4_ = 0xfe; -1 < r._4_4_; r._4_4_ = r._4_4_ + -1) {
    b_00 = (long)(int)((int)(uint)*(byte *)((long)x + (long)(r._4_4_ >> 3) + 0x78) >>
                       ((byte)r._4_4_ & 7) & 1);
    sel25519(b + 0xf,c + 0xf,b_00);
    sel25519(d + 0xf,e + 0xf,b_00);
    add(f + 0xf,b + 0xf,d + 0xf);
    sub(b + 0xf,b + 0xf,d + 0xf);
    add(d + 0xf,c + 0xf,e + 0xf);
    sub(c + 0xf,c + 0xf,e + 0xf);
    sqr(e + 0xf,f + 0xf);
    sqr((int64_t *)&i,b + 0xf);
    mul(b + 0xf,d + 0xf,b + 0xf);
    mul(d + 0xf,c + 0xf,f + 0xf);
    add(f + 0xf,b + 0xf,d + 0xf);
    sub(b + 0xf,b + 0xf,d + 0xf);
    sqr(c + 0xf,b + 0xf);
    sub(d + 0xf,e + 0xf,(int64_t *)&i);
    mul(b + 0xf,d + 0xf,_121665);
    add(b + 0xf,b + 0xf,e + 0xf);
    mul(d + 0xf,d + 0xf,b + 0xf);
    mul(b + 0xf,e + 0xf,(int64_t *)&i);
    mul(e + 0xf,c + 0xf,a + 0xf);
    sqr(c + 0xf,f + 0xf);
    sel25519(b + 0xf,c + 0xf,b_00);
    sel25519(d + 0xf,e + 0xf,b_00);
  }
  inv25519(d + 0xf,d + 0xf);
  mul(b + 0xf,b + 0xf,d + 0xf);
  pack25519(q,b + 0xf);
  return;
}

Assistant:

void cf_curve25519_mul(uint8_t *q, const uint8_t *n, const uint8_t *p)
{
  uint8_t z[32];
  gf x;
  gf a, b, c, d, e, f;

  {
  size_t i;
  for (i = 0; i < 31; i++)
    z[i] = n[i];
  z[31] = (n[31] & 127) | 64;
  z[0] &= 248;
  
  unpack25519(x, p);

  for(i = 0; i < 16; i++)
  {
    b[i] = x[i];
    d[i] = a[i] = c[i] = 0;
  }
  }

  a[0] = d[0] = 1;

  {int i;
  for (i = 254; i >= 0; i--)
  {
    int64_t r = (z[i >> 3] >> (i & 7)) & 1;
    sel25519(a, b, r);
    sel25519(c, d, r);
    add(e, a, c);
    sub(a, a, c);
    add(c, b, d);
    sub(b, b, d);
    sqr(d, e);
    sqr(f, a);
    mul(a, c, a);
    mul(c, b, e);
    add(e, a, c);
    sub(a, a, c);
    sqr(b, a);
    sub(c, d, f);
    mul(a, c, _121665);
    add(a, a, d);
    mul(c, c, a);
    mul(a, d, f);
    mul(d, b, x);
    sqr(b, e);
    sel25519(a, b, r);
    sel25519(c, d, r);
  }
  }

  inv25519(c, c);
  mul(a, a, c);
  pack25519(q, a);
}